

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.cpp
# Opt level: O0

void rasterize(vector<Shape,_std::allocator<Shape>_> *shapes,char *file_name,size_t width,
              size_t height)

{
  float fVar1;
  value_type l0_00;
  value_type l1_00;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  reference shape_00;
  const_reference pvVar5;
  iterator __first;
  iterator __last;
  RasterizeLine *pRVar6;
  reference ppRVar7;
  reference ppRVar8;
  float local_230;
  reference local_220;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_218;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_210;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_208;
  const_iterator local_200;
  reference local_1f8;
  value_type *local_1f0;
  RasterizeLine *line;
  iterator __end3;
  iterator __begin3;
  vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  *__range3;
  Strip strip;
  float intersection;
  RasterizeLine *l1;
  RasterizeLine *l0;
  size_t i;
  float next_y;
  int iStack_178;
  float fStack_174;
  Event event;
  vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  current_lines;
  undefined1 local_148 [4];
  float y;
  Pixmap pixmap;
  Event local_118;
  RasterizeLine local_108;
  Event local_f0;
  Event local_e0;
  RasterizeLine local_d0;
  size_type local_b8;
  size_t index;
  Segment *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Segment,_std::allocator<Segment>_> *__range2;
  Shape *shape;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Shape,_std::allocator<Shape>_> *__range1;
  undefined1 local_60 [8];
  priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
  events;
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  lines;
  size_t height_local;
  size_t width_local;
  char *file_name_local;
  vector<Shape,_std::allocator<Shape>_> *shapes_local;
  
  std::
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ::vector((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
            *)&events.field_0x18);
  std::
  priority_queue<(anonymous_namespace)::Event,std::vector<(anonymous_namespace)::Event,std::allocator<(anonymous_namespace)::Event>>,std::greater<(anonymous_namespace)::Event>>
  ::
  priority_queue<std::vector<(anonymous_namespace)::Event,std::allocator<(anonymous_namespace)::Event>>,void>
            ((priority_queue<(anonymous_namespace)::Event,std::vector<(anonymous_namespace)::Event,std::allocator<(anonymous_namespace)::Event>>,std::greater<(anonymous_namespace)::Event>>
              *)local_60);
  __end1 = std::vector<Shape,_std::allocator<Shape>_>::begin(shapes);
  shape = (Shape *)std::vector<Shape,_std::allocator<Shape>_>::end(shapes);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Shape_*,_std::vector<Shape,_std::allocator<Shape>_>_>
                                     *)&shape), bVar4) {
    shape_00 = __gnu_cxx::
               __normal_iterator<const_Shape_*,_std::vector<Shape,_std::allocator<Shape>_>_>::
               operator*(&__end1);
    __end2 = std::vector<Segment,_std::allocator<Segment>_>::begin(&shape_00->segments);
    s = (Segment *)std::vector<Segment,_std::allocator<Segment>_>::end(&shape_00->segments);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_Segment_*,_std::vector<Segment,_std::allocator<Segment>_>_>
                                       *)&s), bVar4) {
      index = (size_t)__gnu_cxx::
                      __normal_iterator<const_Segment_*,_std::vector<Segment,_std::allocator<Segment>_>_>
                      ::operator*(&__end2);
      local_b8 = std::
                 vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                 ::size((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                         *)&events.field_0x18);
      if (*(float *)(index + 4) <= *(float *)index) {
        anon_unknown.dwarf_30bed::RasterizeLine::RasterizeLine
                  (&local_108,(Line *)(index + 8),-1,shape_00);
        std::
        vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ::push_back((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                     *)&events.field_0x18,&local_108);
        anon_unknown.dwarf_30bed::Event::Event(&local_118,LINE_START,*(float *)(index + 4),local_b8)
        ;
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                *)local_60,&local_118);
        anon_unknown.dwarf_30bed::Event::Event
                  ((Event *)&pixmap.width,LINE_END,*(float *)index,local_b8);
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                *)local_60,(value_type *)&pixmap.width);
      }
      else {
        anon_unknown.dwarf_30bed::RasterizeLine::RasterizeLine
                  (&local_d0,(Line *)(index + 8),1,shape_00);
        std::
        vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ::push_back((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                     *)&events.field_0x18,&local_d0);
        anon_unknown.dwarf_30bed::Event::Event(&local_e0,LINE_START,*(float *)index,local_b8);
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                *)local_60,&local_e0);
        anon_unknown.dwarf_30bed::Event::Event(&local_f0,LINE_END,*(float *)(index + 4),local_b8);
        std::
        priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
        ::push((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                *)local_60,&local_f0);
      }
      __gnu_cxx::__normal_iterator<const_Segment_*,_std::vector<Segment,_std::allocator<Segment>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::__normal_iterator<const_Shape_*,_std::vector<Shape,_std::allocator<Shape>_>_>::
    operator++(&__end1);
  }
  Pixmap::Pixmap((Pixmap *)local_148,width,height);
  bVar4 = std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::empty((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                   *)local_60);
  if (bVar4) {
    local_230 = 0.0;
  }
  else {
    pvVar5 = std::
             priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
             ::top((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                    *)local_60);
    local_230 = pvVar5->y;
  }
  current_lines.
  super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_230;
  std::
  vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  ::vector((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
            *)&event.index);
  while (bVar4 = std::
                 priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                 ::empty((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                          *)local_60), ((bVar4 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::
             priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
             ::top((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                    *)local_60);
    uVar2 = pvVar5->type;
    uVar3 = pvVar5->y;
    event._0_8_ = pvVar5->index;
    std::
    priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
    ::pop((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
           *)local_60);
    while (current_lines.
           super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < (float)uVar3) {
      __first = std::
                vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                ::begin((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                         *)&event.index);
      __last = std::
               vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
               ::end((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                      *)&event.index);
      std::
      sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>
                ((__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                  )__first._M_current,
                 (__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                  )__last._M_current,
                 current_lines.
                 super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      i._0_4_ = (float)uVar3;
      for (l0 = (RasterizeLine *)0x1;
          pRVar6 = (RasterizeLine *)
                   std::
                   vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                   ::size((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                           *)&event.index), l0 < pRVar6;
          l0 = (RasterizeLine *)((long)&(l0->super_Line).m + 1)) {
        ppRVar7 = std::
                  vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                  ::operator[]((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                                *)&event.index,(size_type)((long)&l0[-1].shape + 7));
        l0_00 = *ppRVar7;
        ppRVar7 = std::
                  vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                  ::operator[]((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                                *)&event.index,(size_type)l0);
        l1_00 = *ppRVar7;
        fVar1 = (l0_00->super_Line).m;
        if ((((fVar1 != (l1_00->super_Line).m) || (NAN(fVar1) || NAN((l1_00->super_Line).m))) &&
            (strip.lines.
             super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                  intersect(&l0_00->super_Line,&l1_00->super_Line),
            current_lines.
            super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
            strip.lines.
            super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) &&
           (strip.lines.
            super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < (float)i)) {
          i._0_4_ = strip.lines.
                    super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
      }
      anon_unknown.dwarf_30bed::Strip::Strip
                ((Strip *)&__range3,
                 current_lines.
                 super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(float)i);
      __end3 = std::
               vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
               ::begin((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                        *)&event.index);
      line = (RasterizeLine *)
             std::
             vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
             ::end((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                    *)&event.index);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                                         *)&line), bVar4) {
        ppRVar8 = __gnu_cxx::
                  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
                  ::operator*(&__end3);
        local_1f0 = *ppRVar8;
        std::
        vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
        ::push_back((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                     *)&strip,local_1f0);
        __gnu_cxx::
        __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
        ::operator++(&__end3);
      }
      anon_unknown.dwarf_30bed::rasterize_strip((Strip *)&__range3,(Pixmap *)local_148);
      current_lines.
      super__Vector_base<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (float)i;
      anon_unknown.dwarf_30bed::Strip::~Strip((Strip *)&__range3);
    }
    if (uVar2 == 0) {
      local_1f8 = std::
                  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                  ::operator[]((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                                *)&events.field_0x18,event._0_8_);
      std::
      vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
      ::push_back((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                   *)&event.index,&local_1f8);
    }
    else if (uVar2 == 1) {
      local_210._M_current =
           (RasterizeLine **)
           std::
           vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
           ::begin((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                    *)&event.index);
      local_218._M_current =
           (RasterizeLine **)
           std::
           vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
           ::end((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
                  *)&event.index);
      local_220 = std::
                  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                  ::operator[]((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                                *)&events.field_0x18,event._0_8_);
      local_208 = std::
                  find<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,(anonymous_namespace)::RasterizeLine*>
                            (local_210,local_218,&local_220);
      __gnu_cxx::
      __normal_iterator<(anonymous_namespace)::RasterizeLine_const*const*,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>
      ::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**>
                ((__normal_iterator<(anonymous_namespace)::RasterizeLine_const*const*,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>
                  *)&local_200,&local_208);
      std::
      vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
      ::erase((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
               *)&event.index,local_200);
    }
  }
  write_png((Pixmap *)local_148,file_name);
  std::
  vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
  ::~vector((vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>
             *)&event.index);
  Pixmap::~Pixmap((Pixmap *)local_148);
  std::
  priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
  ::~priority_queue((priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
                     *)local_60);
  std::
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ::~vector((vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
             *)&events.field_0x18);
  return;
}

Assistant:

void rasterize(const std::vector<Shape>& shapes, const char* file_name, size_t width, size_t height) {
	// collect lines and events
	std::vector<RasterizeLine> lines;
	std::priority_queue<Event, std::vector<Event>, std::greater<Event>> events;
	for (const Shape& shape: shapes) {
		for (const Segment& s: shape.segments) {
			const size_t index = lines.size();
			if (s.y0 < s.y1) {
				lines.push_back(RasterizeLine(s.line, 1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y0, index));
				events.push(Event(Event::Type::LINE_END, s.y1, index));
			}
			else {
				lines.push_back(RasterizeLine(s.line, -1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y1, index));
				events.push(Event(Event::Type::LINE_END, s.y0, index));
			}
		}
	}

	Pixmap pixmap(width, height);

	float y = events.empty() ? 0.f : events.top().y;
	std::vector<const RasterizeLine*> current_lines;
	while (!events.empty()) {
		Event event = events.top();
		events.pop();
		while (y < event.y) {
			std::sort(current_lines.begin(), current_lines.end(), [y](const RasterizeLine* l0, const RasterizeLine* l1) {
				const float x0 = l0->get_x(y);
				const float x1 = l1->get_x(y);
				if (x0 == x1) {
					return l0->m < l1->m;
				}
				return x0 < x1;
			});
			float next_y = event.y;
			// find intersections
			for (size_t i = 1; i < current_lines.size(); ++i) {
				const RasterizeLine& l0 = *current_lines[i-1];
				const RasterizeLine& l1 = *current_lines[i];
				if (l0.m != l1.m) {
					const float intersection = intersect(l0, l1);
					if (y < intersection && intersection < next_y) {
						next_y = intersection;
					}
				}
			}
			Strip strip(y, next_y);
			for (const RasterizeLine* line: current_lines) {
				strip.lines.push_back(*line);
			}
			rasterize_strip(strip, pixmap);
			y = next_y;
		}
		switch (event.type) {
		case Event::Type::LINE_START:
			current_lines.push_back(&lines[event.index]);
			break;
		case Event::Type::LINE_END:
			current_lines.erase(std::find(current_lines.begin(), current_lines.end(), &lines[event.index]));
			break;
		}
	}

	write_png(pixmap, file_name);
}